

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O0

MPP_RET mpp_ops_enc_get_pkt(MppDump info,MppPacket pkt)

{
  size_t sVar1;
  void *__ptr;
  undefined1 local_40 [8];
  AutoMutex auto_lock;
  RK_U32 length;
  MppDumpImpl *p;
  MppPacket pkt_local;
  MppDump info_local;
  
  if ((info != (MppDump)0x0) && (pkt != (MppPacket)0x0)) {
    sVar1 = mpp_packet_get_length(pkt);
    auto_lock.mLock._4_4_ = (uint)sVar1;
    Mutex::Autolock::Autolock((Autolock *)local_40,*info,1);
    if (*(long *)((long)info + 0x30) != 0) {
      __ptr = mpp_packet_get_data(pkt);
      fwrite(__ptr,1,(ulong)auto_lock.mLock._4_4_,*(FILE **)((long)info + 0x30));
      fflush(*(FILE **)((long)info + 0x30));
    }
    Mutex::Autolock::~Autolock((Autolock *)local_40);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_ops_enc_get_pkt(MppDump info, MppPacket pkt)
{
    MppDumpImpl *p = (MppDumpImpl *)info;
    if (NULL == p || NULL == pkt)
        return MPP_OK;

    RK_U32 length = mpp_packet_get_length(pkt);
    AutoMutex auto_lock(p->lock);

    if (p->fp_out) {
        fwrite(mpp_packet_get_data(pkt), 1, length, p->fp_out);
        fflush(p->fp_out);
    }

    return MPP_OK;
}